

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O3

int pub0_pipe_start(void *arg)

{
  nni_list *mtx;
  nni_list *list;
  uint16_t uVar1;
  int iVar2;
  
  list = *(nni_list **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x21) {
    mtx = list + 1;
    nni_mtx_lock((nni_mtx *)mtx);
    nni_list_append(list,arg);
    nni_mtx_unlock((nni_mtx *)mtx);
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x228));
    iVar2 = 0;
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x21
                );
    iVar2 = 0xd;
  }
  return iVar2;
}

Assistant:

static int
pub0_pipe_start(void *arg)
{
	pub0_pipe *p    = arg;
	pub0_sock *sock = p->pub;

	if (nni_pipe_peer(p->pipe) != NNI_PROTO_SUB_V0) {
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), NNI_PROTO_SUB_V0);
		return (NNG_EPROTO);
	}
	nni_mtx_lock(&sock->mtx);
	nni_list_append(&sock->pipes, p);
	nni_mtx_unlock(&sock->mtx);

	// Start the receiver.
	nni_pipe_recv(p->pipe, &p->aio_recv);

	return (0);
}